

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3SelectLeaf(Fts3Table *p,char *zTerm,int nTerm,char *zNode,int nNode,sqlite3_int64 *piLeaf,
                  sqlite3_int64 *piLeaf2)

{
  Fts3Table *p_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  void *__s2;
  sqlite3_int64 *psVar7;
  long lVar8;
  long *plVar9;
  long *plVar10;
  void *p_01;
  undefined4 in_register_00000084;
  int *pnLoad;
  char *pcVar11;
  char *p_02;
  char *__src;
  int nBlob;
  sqlite3_int64 iChild;
  int iHeight;
  uint local_94;
  char *local_90;
  int local_84;
  void *local_80;
  int local_74;
  long *local_70;
  int local_64;
  Fts3Table *local_60;
  char *local_58;
  char *local_50;
  ulong local_48;
  long *local_40;
  long *local_38;
  
  pnLoad = (int *)CONCAT44(in_register_00000084,nNode);
  local_84 = nTerm;
  local_70 = piLeaf;
  iVar2 = (int)*zNode;
  local_60 = p;
  local_58 = zTerm;
  if (*zNode < '\0') {
    sqlite3Fts3GetVarint32(zNode,&local_64);
    iVar2 = local_64;
  }
  local_64 = iVar2;
  pcVar11 = zNode + nNode;
  iVar2 = sqlite3Fts3GetVarint(zNode,(sqlite_int64 *)&local_90);
  iVar3 = sqlite3Fts3GetVarint(zNode + iVar2,(sqlite_int64 *)&local_90);
  p_02 = zNode + iVar2 + iVar3;
  if (pcVar11 < p_02) {
    return 0x10b;
  }
  local_48 = 0;
  iVar2 = local_84;
  plVar9 = piLeaf2;
  plVar10 = local_70;
  if (p_02 < pcVar11) {
    bVar1 = false;
    local_80 = (void *)0x0;
    local_50 = pcVar11;
    do {
      pcVar11 = local_50;
      if (plVar10 == (long *)0x0 && plVar9 == (long *)0x0) {
        iVar3 = 0;
        p_01 = local_80;
        goto LAB_0017579d;
      }
      local_74 = 0;
      local_38 = plVar10;
      if (bVar1) {
        if (*p_02 < '\0') {
          uVar4 = sqlite3Fts3GetVarint32(p_02,&local_74);
          uVar6 = (ulong)uVar4;
        }
        else {
          uVar6 = 1;
          local_74 = (int)*p_02;
        }
        p_02 = p_02 + uVar6;
      }
      local_40 = plVar9;
      if (*p_02 < '\0') {
        uVar4 = sqlite3Fts3GetVarint32(p_02,(int *)&local_94);
        uVar6 = (ulong)uVar4;
        uVar4 = local_94;
      }
      else {
        uVar6 = 1;
        uVar4 = (int)*p_02;
      }
      lVar8 = (long)local_74;
      iVar3 = 0x10b;
      p_01 = local_80;
      iVar2 = local_84;
      if ((lVar8 < 0) || ((int)uVar4 < 0)) goto LAB_0017579d;
      __src = p_02 + uVar6;
      p_02 = __src + uVar4;
      if (pcVar11 < p_02) goto LAB_0017579d;
      iVar3 = local_74 + uVar4;
      __s2 = local_80;
      if ((int)local_48 < iVar3) {
        iVar2 = sqlite3_initialize();
        p_01 = local_80;
        if (iVar2 != 0) {
          iVar3 = 7;
          iVar2 = local_84;
          goto LAB_0017579d;
        }
        local_48 = (ulong)(uint)(iVar3 * 2);
        __s2 = sqlite3Realloc(local_80,local_48);
        if (__s2 == (void *)0x0) {
          iVar2 = local_84;
          iVar3 = 7;
          goto LAB_0017579d;
        }
      }
      memcpy((void *)(lVar8 + (long)__s2),__src,(ulong)uVar4);
      iVar2 = local_84;
      iVar5 = local_84;
      if (iVar3 < local_84) {
        iVar5 = iVar3;
      }
      local_80 = __s2;
      iVar5 = memcmp(local_58,__s2,(long)iVar5);
      plVar9 = local_40;
      if (local_38 == (long *)0x0) {
LAB_00175713:
        if ((local_40 == (long *)0x0) || (-1 < iVar5)) {
          plVar10 = (long *)0x0;
        }
        else {
          *local_40 = (long)local_90;
          plVar10 = (long *)0x0;
          plVar9 = (long *)0x0;
        }
      }
      else if ((iVar5 < 0) || (plVar10 = local_38, iVar2 < iVar3 && iVar5 == 0)) {
        *local_38 = (long)local_90;
        goto LAB_00175713;
      }
      local_90 = local_90 + 1;
      bVar1 = true;
    } while (p_02 < local_50);
  }
  else {
    local_80 = (void *)0x0;
  }
  if (plVar10 != (long *)0x0) {
    *plVar10 = (long)local_90;
  }
  p_01 = local_80;
  iVar3 = 0;
  if (plVar9 != (long *)0x0) {
    *plVar9 = (long)local_90;
    iVar3 = 0;
  }
LAB_0017579d:
  p_00 = local_60;
  plVar9 = local_70;
  sqlite3_free(p_01);
  if (iVar3 != 0) {
    return iVar3;
  }
  if (local_64 < 2) {
    return 0;
  }
  local_90 = (char *)0x0;
  local_94 = 0;
  if ((piLeaf2 != (sqlite3_int64 *)0x0 && plVar9 != (sqlite3_int64 *)0x0) && (*plVar9 != *piLeaf2))
  {
    iVar3 = sqlite3Fts3ReadBlock(p_00,*plVar9,&local_90,(int *)&local_94,pnLoad);
    if (iVar3 == 0) {
      pnLoad = (int *)(ulong)local_94;
      iVar3 = fts3SelectLeaf(p_00,local_58,iVar2,local_90,local_94,plVar9,(sqlite3_int64 *)0x0);
    }
    sqlite3_free(local_90);
    local_90 = (char *)0x0;
    plVar9 = (sqlite3_int64 *)0x0;
    if (iVar3 != 0) goto LAB_001758a3;
  }
  local_90 = (char *)0x0;
  psVar7 = plVar9;
  if (plVar9 == (sqlite3_int64 *)0x0) {
    psVar7 = piLeaf2;
  }
  iVar3 = sqlite3Fts3ReadBlock(p_00,*psVar7,&local_90,(int *)&local_94,pnLoad);
  if (iVar3 == 0) {
    iVar3 = fts3SelectLeaf(p_00,local_58,iVar2,local_90,local_94,plVar9,piLeaf2);
  }
LAB_001758a3:
  sqlite3_free(local_90);
  return iVar3;
}

Assistant:

static int fts3SelectLeaf(
  Fts3Table *p,                   /* Virtual table handle */
  const char *zTerm,              /* Term to select leaves for */
  int nTerm,                      /* Size of term zTerm in bytes */
  const char *zNode,              /* Buffer containing segment interior node */
  int nNode,                      /* Size of buffer at zNode */
  sqlite3_int64 *piLeaf,          /* Selected leaf node */
  sqlite3_int64 *piLeaf2          /* Selected leaf node */
){
  int rc = SQLITE_OK;             /* Return code */
  int iHeight;                    /* Height of this node in tree */

  assert( piLeaf || piLeaf2 );

  fts3GetVarint32(zNode, &iHeight);
  rc = fts3ScanInteriorNode(zTerm, nTerm, zNode, nNode, piLeaf, piLeaf2);
  assert( !piLeaf2 || !piLeaf || rc!=SQLITE_OK || (*piLeaf<=*piLeaf2) );

  if( rc==SQLITE_OK && iHeight>1 ){
    char *zBlob = 0;              /* Blob read from %_segments table */
    int nBlob = 0;                /* Size of zBlob in bytes */

    if( piLeaf && piLeaf2 && (*piLeaf!=*piLeaf2) ){
      rc = sqlite3Fts3ReadBlock(p, *piLeaf, &zBlob, &nBlob, 0);
      if( rc==SQLITE_OK ){
        rc = fts3SelectLeaf(p, zTerm, nTerm, zBlob, nBlob, piLeaf, 0);
      }
      sqlite3_free(zBlob);
      piLeaf = 0;
      zBlob = 0;
    }

    if( rc==SQLITE_OK ){
      rc = sqlite3Fts3ReadBlock(p, piLeaf?*piLeaf:*piLeaf2, &zBlob, &nBlob, 0);
    }
    if( rc==SQLITE_OK ){
      rc = fts3SelectLeaf(p, zTerm, nTerm, zBlob, nBlob, piLeaf, piLeaf2);
    }
    sqlite3_free(zBlob);
  }

  return rc;
}